

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall
FFont::FFont(FFont *this,char *name,char *nametemplate,int first,int count,int start,int fdlump,
            int spacewidth)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FTextureID FVar5;
  FTextureID FVar6;
  FTextureID FVar7;
  CharData *pCVar8;
  void *pvVar9;
  BYTE *pBVar10;
  char *pcVar11;
  FTexture *pFVar12;
  FFontChar1 *this_00;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  char buffer [12];
  char local_3c [12];
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_00703048;
  (this->Ranges).Array = (FRemapTable *)0x0;
  (this->Ranges).Most = 0;
  (this->Ranges).Count = 0;
  if (((undefined1)gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    bVar19 = false;
  }
  else {
    iVar3 = strncmp(nametemplate,"STCFN",5);
    bVar19 = iVar3 == 0;
  }
  this->Lump = fdlump;
  uVar17 = (long)count << 4;
  if (count < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pCVar8 = (CharData *)operator_new__(uVar17);
  uVar17 = (long)count * 8;
  this->Chars = pCVar8;
  if (count < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar17);
  pBVar10 = (BYTE *)operator_new__(0x100);
  this->PatchRemap = pBVar10;
  this->FirstChar = first;
  this->LastChar = count + first + -1;
  this->FontHeight = 0;
  this->GlobalKerning = 0;
  pcVar11 = copystring(name);
  this->Name = pcVar11;
  this->Next = FirstFont;
  FirstFont = this;
  this->Cursor = '_';
  if (0 < count) {
    uVar4 = 0x7c - start;
    lVar18 = (long)start + -0x79;
    bVar2 = false;
    lVar16 = 0;
    do {
      *(undefined8 *)((long)pvVar9 + lVar16) = 0;
      mysnprintf(local_3c,0xc,nametemplate,(ulong)(uint)start);
      FVar5 = FTextureManager::CheckForTexture(&TexMan,local_3c,8,1);
      FVar7 = FVar5;
      if ((bVar19) && (lVar18 == 0 && 0 < FVar5.texnum)) {
        FVar6 = FTextureManager::CheckForTexture(&TexMan,"STCFN120",8,1);
        if (FVar6.texnum < 1) {
          if ((int)uVar4 < count) goto LAB_004900a7;
        }
        else {
          FVar6 = FTextureManager::CheckForTexture(&TexMan,"STCFN122",8,1);
          if (FVar6.texnum < 1) {
            bVar2 = true;
            FVar7.texnum = 0xffffffff;
          }
          if (0 < FVar6.texnum || count <= (int)uVar4) goto LAB_0048ff83;
LAB_004900a7:
          if ((uint)FVar5.texnum < TexMan.Textures.Count) {
            pFVar12 = TexMan.Textures.Array[(uint)FVar5.texnum].Texture;
          }
          else {
            pFVar12 = (FTexture *)0x0;
          }
          *(FTexture **)((long)pvVar9 + (long)(int)uVar4 * 8) = pFVar12;
        }
        bVar2 = true;
        FVar7.texnum = 0xffffffff;
      }
LAB_0048ff83:
      if (0 < FVar7.texnum) {
        if ((uint)FVar7.texnum < TexMan.Textures.Count) {
          pFVar12 = TexMan.Textures.Array[(uint)FVar7.texnum].Texture;
        }
        else {
          pFVar12 = (FTexture *)0x0;
        }
        if (pFVar12 != (FTexture *)0x0) {
          if (((ulong)uVar4 * 8 != lVar16) || (!bVar2)) {
            *(FTexture **)((long)pvVar9 + lVar16) = pFVar12;
          }
          dVar1 = (pFVar12->Scale).Y;
          uVar13 = (uint)((double)((uint)pFVar12->Height * 2) / dVar1);
          uVar14 = (uint)((double)(pFVar12->TopOffset * 2) / dVar1);
          iVar15 = (uVar14 & 1) + ((int)uVar14 >> 1);
          iVar3 = -iVar15;
          if (0 < iVar15) {
            iVar3 = iVar15;
          }
          iVar3 = iVar3 + (uVar13 & 1) + ((int)uVar13 >> 1);
          if (this->FontHeight < iVar3) {
            this->FontHeight = iVar3;
          }
        }
      }
      pFVar12 = *(FTexture **)((long)pvVar9 + lVar16);
      if (pFVar12 == (FTexture *)0x0) {
        pCVar8 = this->Chars;
        *(undefined8 *)((long)&pCVar8->Pic + lVar16 * 2) = 0;
        iVar3 = -0x80000000;
      }
      else {
        this_00 = (FFontChar1 *)operator_new(0x70);
        FFontChar1::FFontChar1(this_00,pFVar12);
        pCVar8 = this->Chars;
        *(FFontChar1 **)((long)&pCVar8->Pic + lVar16 * 2) = this_00;
        uVar13 = (uint)((double)((uint)(this_00->super_FTexture).Width * 2) /
                       (this_00->super_FTexture).Scale.X);
        iVar3 = (uVar13 & 1) + ((int)uVar13 >> 1);
      }
      *(int *)((long)&pCVar8->XMove + lVar16 * 2) = iVar3;
      lVar16 = lVar16 + 8;
      lVar18 = lVar18 + 1;
      start = start + 1;
    } while ((ulong)(uint)count << 3 != lVar16);
  }
  if (spacewidth == -1) {
    uVar4 = 0x4e - first;
    spacewidth = 4;
    if ((int)uVar4 < count && first < 0x4f) {
      if (this->Chars[uVar4].Pic != (FTexture *)0x0) {
        iVar3 = this->Chars[uVar4].XMove;
        spacewidth = (iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1;
      }
    }
  }
  this->SpaceWidth = spacewidth;
  FixXMoves(this);
  (*this->_vptr_FFont[4])(this);
  operator_delete__(pvVar9);
  return;
}

Assistant:

FFont::FFont (const char *name, const char *nametemplate, int first, int count, int start, int fdlump, int spacewidth)
{
	int i;
	FTextureID lump;
	char buffer[12];
	FTexture **charlumps;
	int maxyoffs;
	bool doomtemplate = gameinfo.gametype & GAME_DoomChex ? strncmp (nametemplate, "STCFN", 5) == 0 : false;
	bool stcfn121 = false;

	Lump = fdlump;
	Chars = new CharData[count];
	charlumps = new FTexture *[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Name = copystring (name);
	Next = FirstFont;
	FirstFont = this;
	Cursor = '_';

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		charlumps[i] = NULL;
		mysnprintf (buffer, countof(buffer), nametemplate, i + start);

		lump = TexMan.CheckForTexture(buffer, FTexture::TEX_MiscPatch);
		if (doomtemplate && lump.isValid() && i + start == 121)
		{ // HACKHACK: Don't load STCFN121 in doom(2), because
		  // it's not really a lower-case 'y' but a '|'.
		  // Because a lot of wads with their own font seem to foolishly
		  // copy STCFN121 and make it a '|' themselves, wads must
		  // provide STCFN120 (x) and STCFN122 (z) for STCFN121 to load as a 'y'.
			if (!TexMan.CheckForTexture("STCFN120", FTexture::TEX_MiscPatch).isValid() ||
				!TexMan.CheckForTexture("STCFN122", FTexture::TEX_MiscPatch).isValid())
			{
				// insert the incorrectly named '|' graphic in its correct position.
				if (count > 124-start) charlumps[124-start] = TexMan[lump];
				lump.SetInvalid();
				stcfn121 = true;
			}
		}

		if (lump.isValid())
		{
			FTexture *pic = TexMan[lump];
			if (pic != NULL)
			{
				// set the lump here only if it represents a valid texture
				if (i != 124-start || !stcfn121)
					charlumps[i] = pic;

				int height = pic->GetScaledHeight();
				int yoffs = pic->GetScaledTopOffset();

				if (yoffs > maxyoffs)
				{
					maxyoffs = yoffs;
				}
				height += abs (yoffs);
				if (height > FontHeight)
				{
					FontHeight = height;
				}
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	if (spacewidth != -1)
	{
		SpaceWidth = spacewidth;
	}
	else if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}